

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O0

void __thiscall
capnp::anon_unknown_56::ThrowingErrorReporter::addError
          (ThrowingErrorReporter *this,uint32_t startByte,uint32_t endByte,StringPtr message)

{
  bool bVar1;
  char cVar2;
  uint *puVar3;
  undefined4 in_stack_fffffffffffffdc8;
  int local_200;
  int local_1fc;
  String local_1f8;
  Exception local_1e0;
  uint local_4c;
  Iterator local_48;
  uint i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_int> *__range2;
  uint32_t lineStart;
  uint line;
  uint32_t endByte_local;
  uint32_t startByte_local;
  ThrowingErrorReporter *this_local;
  StringPtr message_local;
  
  message_local.content.ptr = (char *)message.content.size_;
  this_local = (ThrowingErrorReporter *)message.content.ptr;
  __range2._4_4_ = 1;
  __range2._0_4_ = 0;
  ___end2 = kj::zeroTo<unsigned_int>(startByte);
  i = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end2);
  local_48 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end2);
  while( true ) {
    bVar1 = kj::Range<unsigned_int>::Iterator::operator==((Iterator *)&i,&local_48);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    puVar3 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&i);
    local_4c = *puVar3;
    cVar2 = kj::StringPtr::operator[](&this->input,(ulong)local_4c);
    if (cVar2 == '\n') {
      __range2._4_4_ = __range2._4_4_ + 1;
      __range2._0_4_ = local_4c;
    }
    kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&i);
  }
  local_1fc = startByte - (uint)__range2;
  local_200 = endByte - (uint)__range2;
  kj::str<unsigned_int,char_const(&)[2],unsigned_int,char_const(&)[3],kj::StringPtr&>
            (&local_1f8,(kj *)&local_1fc,(uint *)0x3c3ed5,(char (*) [2])&local_200,(uint *)0x399f65,
             (char (*) [3])&this_local,
             (StringPtr *)CONCAT44(__range2._4_4_,in_stack_fffffffffffffdc8));
  kj::Exception::Exception(&local_1e0,FAILED,"(capnp text input)",__range2._4_4_,&local_1f8);
  kj::throwRecoverableException(&local_1e0,0);
  kj::Exception::~Exception(&local_1e0);
  kj::String::~String(&local_1f8);
  return;
}

Assistant:

void addError(uint32_t startByte, uint32_t endByte, kj::StringPtr message) override {
    // Note: Line and column numbers are usually 1-based.
    uint line = 1;
    uint32_t lineStart = 0;
    for (auto i: kj::zeroTo(startByte)) {
      if (input[i] == '\n') {
        ++line;
        lineStart = i;  // Omit +1 so that column is 1-based.
      }
    }

    kj::throwRecoverableException(kj::Exception(
      kj::Exception::Type::FAILED, "(capnp text input)", line,
      kj::str(startByte - lineStart, "-", endByte - lineStart, ": ", message)
    ));
  }